

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

PyObject * pybind11_meta_getattro(PyObject *obj,PyObject *name)

{
  int iVar1;
  PyObject *pPVar2;
  PyObject *descr;
  PyObject *name_local;
  PyObject *obj_local;
  
  pPVar2 = (PyObject *)_PyType_Lookup(obj,name);
  if ((pPVar2 != (PyObject *)0x0) &&
     (iVar1 = _Py_IS_TYPE(pPVar2,(PyTypeObject *)&PyInstanceMethod_Type), iVar1 != 0)) {
    _Py_INCREF(pPVar2);
    return pPVar2;
  }
  pPVar2 = (PyObject *)(*__Py_Dealloc)(obj,name);
  return pPVar2;
}

Assistant:

inline PyObject *pybind11_meta_getattro(PyObject *obj, PyObject *name) {
    PyObject *descr = _PyType_Lookup((PyTypeObject *) obj, name);
    if (descr && PyInstanceMethod_Check(descr)) {
        Py_INCREF(descr);
        return descr;
    }
    else {
        return PyType_Type.tp_getattro(obj, name);
    }
}